

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoBinop<bool,double>(Thread *this,BinopFunc<bool,_double> *f)

{
  bool value;
  Value VVar1;
  Value VVar2;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  value = (*f)((double)VVar2.i64_,(double)VVar1.i64_);
  Push<bool>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoBinop(BinopFunc<R, T> f) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  Push<R>(f(lhs, rhs));
  return RunResult::Ok;
}